

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

bool headerNameValidImpl(QLatin1StringView name)

{
  _Iter_negate<__7> *p_Var1;
  bool bVar2;
  _Iter_negate<__7> *this;
  _Iter_negate<__7> *__it;
  ulong uVar3;
  long lVar4;
  _Iter_negate<__7> *this_00;
  _Iter_negate<__7> *p_Var5;
  
  this = (_Iter_negate<__7> *)name.m_data;
  uVar3 = name.m_size;
  p_Var1 = this + uVar3;
  this_00 = this;
  __it = this;
  if (0 < (long)uVar3 >> 2) {
    this_00 = this + (uVar3 & 0xfffffffffffffffc);
    lVar4 = ((long)uVar3 >> 2) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this,(char *)__it);
      p_Var5 = this;
      if (bVar2) goto LAB_0018fedf;
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 1,(char *)__it);
      p_Var5 = this + 1;
      if (bVar2) goto LAB_0018fedf;
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 2,(char *)__it);
      p_Var5 = this + 2;
      if (bVar2) goto LAB_0018fedf;
      bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this + 3,(char *)__it);
      p_Var5 = this + 3;
      if (bVar2) goto LAB_0018fedf;
      this = this + 4;
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  lVar4 = (long)p_Var1 - (long)this_00;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      p_Var5 = p_Var1;
      if ((lVar4 != 3) ||
         (bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this_00,(char *)__it),
         p_Var5 = this_00, bVar2)) goto LAB_0018fedf;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this_00,(char *)__it);
    p_Var5 = this_00;
    if (bVar2) goto LAB_0018fedf;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::_Iter_negate<$_7>::operator()(this_00,(char *)__it);
  p_Var5 = this_00;
  if (!bVar2) {
    p_Var5 = p_Var1;
  }
LAB_0018fedf:
  return p_Var5 == p_Var1;
}

Assistant:

static bool headerNameValidImpl(QLatin1StringView name) noexcept
{
    return std::all_of(name.begin(), name.end(), isValidHttpHeaderNameChar);
}